

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlLoadFileContent(char *filename)

{
  int iVar1;
  xmlChar *__buf;
  ssize_t sVar2;
  stat info;
  stat64 sStack_a8;
  
  if ((filename != (char *)0x0) && (iVar1 = stat64(filename,&sStack_a8), -1 < iVar1)) {
    iVar1 = open64(filename,0);
    if (iVar1 < 0) {
      return (xmlChar *)0x0;
    }
    __buf = (xmlChar *)(*xmlMalloc)(sStack_a8.st_size + 10);
    if (__buf == (xmlChar *)0x0) {
      xmlCatalogErrMemory();
      close(iVar1);
    }
    else {
      sVar2 = read(iVar1,__buf,sStack_a8.st_size);
      close(iVar1);
      if (-1 < (int)(uint)sVar2) {
        __buf[(uint)sVar2 & 0x7fffffff] = '\0';
        return __buf;
      }
      (*xmlFree)(__buf);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlLoadFileContent(const char *filename)
{
    int fd;
    int len;
    long size;

    struct stat info;
    xmlChar *content;

    if (filename == NULL)
        return (NULL);

    if (stat(filename, &info) < 0)
        return (NULL);

    fd = open(filename, O_RDONLY);
    if (fd  < 0)
    {
        return (NULL);
    }
    size = info.st_size;
    content = xmlMalloc(size + 10);
    if (content == NULL) {
        xmlCatalogErrMemory();
	close(fd);
        return (NULL);
    }
    len = read(fd, content, size);
    close(fd);
    if (len < 0) {
        xmlFree(content);
        return (NULL);
    }
    content[len] = 0;

    return(content);
}